

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

RPCHelpMan * getnodeaddresses(void)

{
  string name;
  string name_00;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  Fallback fallback;
  Fallback fallback_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  string description_07;
  string description_08;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  long lVar1;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  undefined8 in_stack_fffffffffffff0e8;
  undefined8 in_stack_fffffffffffff0f0;
  undefined8 in_stack_fffffffffffff0f8;
  undefined8 in_stack_fffffffffffff100;
  _Manager_type in_stack_fffffffffffff108;
  undefined8 in_stack_fffffffffffff110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff118;
  pointer in_stack_fffffffffffff128;
  pointer pRVar2;
  pointer in_stack_fffffffffffff130;
  pointer pRVar3;
  pointer in_stack_fffffffffffff138;
  pointer pRVar4;
  _Vector_impl_data in_stack_fffffffffffff140;
  undefined1 in_stack_fffffffffffff158 [16];
  pointer in_stack_fffffffffffff168;
  pointer pRVar5;
  pointer in_stack_fffffffffffff170;
  pointer pRVar6;
  pointer in_stack_fffffffffffff178;
  pointer pRVar7;
  undefined8 in_stack_fffffffffffff180;
  pointer in_stack_fffffffffffff188;
  pointer pRVar8;
  pointer in_stack_fffffffffffff190;
  pointer pRVar9;
  pointer in_stack_fffffffffffff198;
  undefined8 in_stack_fffffffffffff1a0;
  pointer in_stack_fffffffffffff1a8;
  pointer in_stack_fffffffffffff1b0;
  pointer in_stack_fffffffffffff1b8;
  undefined8 in_stack_fffffffffffff1c0;
  pointer in_stack_fffffffffffff1c8;
  allocator<char> local_e11;
  vector<RPCResult,_std::allocator<RPCResult>_> local_e10;
  allocator<char> local_df2;
  allocator<char> local_df1;
  vector<RPCResult,_std::allocator<RPCResult>_> local_df0;
  allocator<char> local_dd2;
  allocator<char> local_dd1;
  RPCResults local_dd0;
  allocator_type local_db1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_db0;
  allocator<char> local_d93;
  allocator<char> local_d92;
  allocator<char> local_d91;
  int local_d90;
  allocator<char> local_d89;
  vector<RPCArg,_std::allocator<RPCArg>_> local_d88;
  allocator<char> local_d6a;
  allocator<char> local_d69;
  string local_d68;
  string local_d48;
  string local_d28;
  string local_d08;
  string local_ce8;
  string local_cc8;
  string local_ca8;
  string local_c88;
  string local_c68;
  string local_c48;
  string local_c28;
  string local_c08;
  string local_be8;
  string local_bc8;
  string local_ba8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b28;
  char *local_b08;
  size_type local_b00;
  char local_af8 [8];
  undefined8 uStack_af0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa8;
  string local_a88 [32];
  string local_a68 [32];
  string local_a48 [32];
  string local_a28 [32];
  string local_a08 [32];
  string local_9e8 [32];
  string local_9c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_988;
  string local_968 [32];
  RPCResult local_948 [4];
  RPCResult local_728;
  string local_6a0 [32];
  string local_680 [32];
  RPCResult local_660;
  string local_5d8 [32];
  string local_5b8 [32];
  RPCResult local_598;
  RPCArgOptions local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_448;
  string local_3e8 [32];
  RPCArgOptions local_3c8;
  string local_380 [32];
  UniValue local_360;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_308;
  string local_2a8 [32];
  RPCArg local_288 [2];
  string local_78 [32];
  string local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"getnodeaddresses",&local_d69);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,
             "Return known addresses, after filtering for quality and recency.\nThese can potentially be used to find new peers in the network.\nThe total number of addresses known to the node may be higher."
             ,&local_d6a);
  std::__cxx11::string::string<std::allocator<char>>(local_2a8,"count",&local_d89);
  local_d90 = 1;
  UniValue::UniValue<int,_int,_true>(&local_360,&local_d90);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_308,&local_360);
  std::__cxx11::string::string<std::allocator<char>>
            (local_380,
             "The maximum number of addresses to return. Specify 0 to return all known addresses.",
             &local_d91);
  local_3c8.oneline_description._M_dataplus._M_p = (pointer)&local_3c8.oneline_description.field_2;
  local_3c8.skip_type_check = false;
  local_3c8.oneline_description._M_string_length = 0;
  local_3c8.oneline_description.field_2._M_local_buf[0] = '\0';
  local_3c8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_3c8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_3c8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_3c8._58_8_ = 0;
  name._M_string_length = in_stack_fffffffffffff0f0;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff0e8;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff0f8;
  name.field_2._8_8_ = in_stack_fffffffffffff100;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff110;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff108;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff118;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff128;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff130;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff138;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff140._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff140._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff140._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff158;
  description_07._M_string_length = (size_type)in_stack_fffffffffffff170;
  description_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffff168;
  description_07.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff178;
  description_07.field_2._8_8_ = in_stack_fffffffffffff180;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff190;
  opts._0_8_ = in_stack_fffffffffffff188;
  opts.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff198;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_fffffffffffff1a0;
  opts.oneline_description.field_2._8_8_ = in_stack_fffffffffffff1a8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff1b0;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff1b8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff1c0;
  opts._64_8_ = in_stack_fffffffffffff1c8;
  RPCArg::RPCArg(local_288,name,(Type)local_2a8,fallback,description_07,opts);
  std::__cxx11::string::string<std::allocator<char>>(local_3e8,"network",&local_d92);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"all networks",&local_d93)
  ;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_448,&local_468);
  GetNetworkNames_abi_cxx11_(&local_db0,false);
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            (&local_4c8,(util *)&local_db0,", ");
  std::operator+(&local_4a8,"Return only addresses of the specified network. Can be one of: ",
                 &local_4c8);
  std::operator+(&local_488,&local_4a8,".");
  local_510.oneline_description._M_dataplus._M_p = (pointer)&local_510.oneline_description.field_2;
  local_510.skip_type_check = false;
  local_510.oneline_description._M_string_length = 0;
  local_510.oneline_description.field_2._M_local_buf[0] = '\0';
  local_510.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_510.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_510.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_510.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_510._58_8_ = 0;
  name_00._M_string_length = in_stack_fffffffffffff0f0;
  name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff0e8;
  name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff0f8;
  name_00.field_2._8_8_ = in_stack_fffffffffffff100;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff110;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff108;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff118;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff128;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff130;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff138;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff140._M_start;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff140._M_finish;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff140._M_end_of_storage;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff158;
  description_08._M_string_length = (size_type)in_stack_fffffffffffff170;
  description_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffff168;
  description_08.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff178;
  description_08.field_2._8_8_ = in_stack_fffffffffffff180;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff190;
  opts_00._0_8_ = in_stack_fffffffffffff188;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff198;
  opts_00.oneline_description.field_2._M_allocated_capacity = in_stack_fffffffffffff1a0;
  opts_00.oneline_description.field_2._8_8_ = in_stack_fffffffffffff1a8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff1b0;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff1b8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff1c0;
  opts_00._64_8_ = in_stack_fffffffffffff1c8;
  RPCArg::RPCArg(local_288 + 1,name_00,(Type)local_3e8,fallback_00,description_08,opts_00);
  __l._M_len = 2;
  __l._M_array = local_288;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_d88,__l,&local_db1);
  std::__cxx11::string::string<std::allocator<char>>(local_5b8,"",&local_dd1);
  std::__cxx11::string::string<std::allocator<char>>(local_5d8,"",&local_dd2);
  std::__cxx11::string::string<std::allocator<char>>(local_680,"",&local_df1);
  std::__cxx11::string::string<std::allocator<char>>(local_6a0,"",&local_df2);
  std::__cxx11::string::string<std::allocator<char>>(local_968,"time",&local_e11);
  std::operator+(&local_9a8,"The ",&UNIX_EPOCH_TIME_abi_cxx11_);
  std::operator+(&local_988,&local_9a8," when the node was last seen");
  m_key_name._M_string_length = in_stack_fffffffffffff0f0;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff0e8;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff0f8;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff100;
  description._M_string_length = in_stack_fffffffffffff110;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff108;
  description.field_2 = in_stack_fffffffffffff118;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff130;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff128;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff138;
  RPCResult::RPCResult(local_948,NUM_TIME,m_key_name,description,inner,SUB81(local_968,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_9c8,"services",(allocator<char> *)&stack0xfffffffffffff1c7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_9e8,"The services offered by the node",
             (allocator<char> *)&stack0xfffffffffffff1c6);
  m_key_name_00._M_string_length = in_stack_fffffffffffff0f0;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff0e8;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff0f8;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff100;
  description_00._M_string_length = in_stack_fffffffffffff110;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff108;
  description_00.field_2 = in_stack_fffffffffffff118;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff130;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff128;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff138;
  RPCResult::RPCResult(local_948 + 1,NUM,m_key_name_00,description_00,inner_00,SUB81(local_9c8,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_a08,"address",(allocator<char> *)&stack0xfffffffffffff1a7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a28,"The address of the node",(allocator<char> *)&stack0xfffffffffffff1a6);
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  m_key_name_01._M_string_length = in_stack_fffffffffffff0f0;
  m_key_name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff0e8;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff0f8;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff100;
  description_01._M_string_length = in_stack_fffffffffffff110;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff108;
  description_01.field_2 = in_stack_fffffffffffff118;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff130;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff128;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff138;
  RPCResult::RPCResult(local_948 + 2,STR,m_key_name_01,description_01,inner_01,SUB81(local_a08,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_a48,"port",(allocator<char> *)&stack0xfffffffffffff187);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a68,"The port number of the node",(allocator<char> *)&stack0xfffffffffffff186);
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  pRVar7 = (pointer)0x0;
  m_key_name_02._M_string_length = in_stack_fffffffffffff0f0;
  m_key_name_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff0e8;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff0f8;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff100;
  description_02._M_string_length = in_stack_fffffffffffff110;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff108;
  description_02.field_2 = in_stack_fffffffffffff118;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff130;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff128;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff138;
  RPCResult::RPCResult(local_948 + 3,NUM,m_key_name_02,description_02,inner_02,SUB81(local_a48,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_a88,"network",(allocator<char> *)&stack0xfffffffffffff167);
  GetNetworkNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&stack0xfffffffffffff148,false);
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            (&local_ae8,(util *)&stack0xfffffffffffff148,", ");
  std::operator+(&local_ac8,"The network (",&local_ae8);
  std::operator+(&local_aa8,&local_ac8,") the node connected through");
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  pRVar4 = (pointer)0x0;
  m_key_name_03._M_string_length = in_stack_fffffffffffff0f0;
  m_key_name_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff0e8;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff0f8;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff100;
  description_03._M_string_length = in_stack_fffffffffffff110;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff108;
  description_03.field_2 = in_stack_fffffffffffff118;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_728,STR,m_key_name_03,description_03,inner_03,SUB81(local_a88,0));
  __l_00._M_len = 5;
  __l_00._M_array = local_948;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_e10,__l_00,(allocator_type *)&stack0xfffffffffffff127);
  m_key_name_04._M_string_length = in_stack_fffffffffffff0f0;
  m_key_name_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff0e8;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_fffffffffffff0f8;
  m_key_name_04.field_2._8_8_ = in_stack_fffffffffffff100;
  description_04._M_string_length = in_stack_fffffffffffff110;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff108;
  description_04.field_2._M_local_buf = in_stack_fffffffffffff118._M_local_buf;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar3;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar2;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar4;
  RPCResult::RPCResult(&local_660,OBJ,m_key_name_04,description_04,inner_04,SUB81(local_680,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_660;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_df0,__l_01,(allocator_type *)&stack0xfffffffffffff126);
  m_key_name_05._M_string_length = in_stack_fffffffffffff0f0;
  m_key_name_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff0e8;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_fffffffffffff0f8;
  m_key_name_05.field_2._8_8_ = in_stack_fffffffffffff100;
  description_05._M_string_length = in_stack_fffffffffffff110;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff108;
  description_05.field_2 = in_stack_fffffffffffff118;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar3;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar2;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar4;
  RPCResult::RPCResult(&local_598,ARR,m_key_name_05,description_05,inner_05,SUB81(local_5b8,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff0f0;
  result._0_8_ = in_stack_fffffffffffff0e8;
  result.m_key_name._M_string_length = in_stack_fffffffffffff0f8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff100;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff108;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff110;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff118;
  result._64_8_ = pRVar2;
  result.m_description._M_dataplus._M_p = (pointer)pRVar3;
  result.m_description._M_string_length = (size_type)pRVar4;
  result._88_24_ = in_stack_fffffffffffff140;
  result.m_cond._8_16_ = in_stack_fffffffffffff158;
  result.m_cond.field_2._8_8_ = pRVar5;
  RPCResults::RPCResults(&local_dd0,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bc8,"getnodeaddresses",(allocator<char> *)&stack0xfffffffffffff125);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_be8,"8",(allocator<char> *)&stack0xfffffffffffff124);
  HelpExampleCli(&local_ba8,&local_bc8,&local_be8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c28,"getnodeaddresses",(allocator<char> *)&stack0xfffffffffffff123);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c48,"4 \"i2p\"",(allocator<char> *)&stack0xfffffffffffff122);
  HelpExampleCli(&local_c08,&local_c28,&local_c48);
  std::operator+(&local_b88,&local_ba8,&local_c08);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c88,"-named getnodeaddresses",
             (allocator<char> *)&stack0xfffffffffffff121);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ca8,"network=onion count=12",
             (allocator<char> *)&stack0xfffffffffffff120);
  HelpExampleCli(&local_c68,&local_c88,&local_ca8);
  std::operator+(&local_b68,&local_b88,&local_c68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ce8,"getnodeaddresses",(allocator<char> *)&stack0xfffffffffffff11f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d08,"8",(allocator<char> *)&stack0xfffffffffffff11e);
  HelpExampleRpc(&local_cc8,&local_ce8,&local_d08);
  std::operator+(&local_b48,&local_b68,&local_cc8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d48,"getnodeaddresses",(allocator<char> *)&stack0xfffffffffffff11d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d68,"4, \"i2p\"",(allocator<char> *)&stack0xfffffffffffff11c);
  HelpExampleRpc(&local_d28,&local_d48,&local_d68);
  std::operator+(&local_b28,&local_b48,&local_d28);
  local_b08 = local_af8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b28._M_dataplus._M_p == &local_b28.field_2) {
    uStack_af0 = local_b28.field_2._8_8_;
  }
  else {
    local_b08 = local_b28._M_dataplus._M_p;
  }
  local_b00 = local_b28._M_string_length;
  local_b28._M_string_length = 0;
  local_b28.field_2._M_local_buf[0] = '\0';
  description_06._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/net.cpp:929:9)>
       ::_M_invoke;
  description_06._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/net.cpp:929:9)>
                ::_M_manager;
  description_06.field_2 = in_stack_fffffffffffff118;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar3;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar2;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar4;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar5;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffff158._0_8_;
  examples.m_examples._M_string_length = in_stack_fffffffffffff158._8_8_;
  examples.m_examples.field_2._8_8_ = pRVar6;
  fun.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffff180;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar7;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar8;
  fun._M_invoker = (_Invoker_type)pRVar9;
  local_b28._M_dataplus._M_p = (pointer)&local_b28.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff0f0,&stack0xfffffffffffff0f8)),
             description_06,args,(RPCResults)in_stack_fffffffffffff140,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff0f8);
  std::__cxx11::string::~string((string *)&local_b08);
  std::__cxx11::string::~string((string *)&local_b28);
  std::__cxx11::string::~string((string *)&local_d28);
  std::__cxx11::string::~string((string *)&local_d68);
  std::__cxx11::string::~string((string *)&local_d48);
  std::__cxx11::string::~string((string *)&local_b48);
  std::__cxx11::string::~string((string *)&local_cc8);
  std::__cxx11::string::~string((string *)&local_d08);
  std::__cxx11::string::~string((string *)&local_ce8);
  std::__cxx11::string::~string((string *)&local_b68);
  std::__cxx11::string::~string((string *)&local_c68);
  std::__cxx11::string::~string((string *)&local_ca8);
  std::__cxx11::string::~string((string *)&local_c88);
  std::__cxx11::string::~string((string *)&local_b88);
  std::__cxx11::string::~string((string *)&local_c08);
  std::__cxx11::string::~string((string *)&local_c48);
  std::__cxx11::string::~string((string *)&local_c28);
  std::__cxx11::string::~string((string *)&local_ba8);
  std::__cxx11::string::~string((string *)&local_be8);
  std::__cxx11::string::~string((string *)&local_bc8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_dd0.m_results);
  RPCResult::~RPCResult(&local_598);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_df0);
  RPCResult::~RPCResult(&local_660);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_e10);
  lVar1 = 0x220;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_948[0].m_type + lVar1));
    lVar1 = lVar1 + -0x88;
  } while (lVar1 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff128);
  std::__cxx11::string::~string((string *)&local_aa8);
  std::__cxx11::string::~string((string *)&local_ac8);
  std::__cxx11::string::~string((string *)&local_ae8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffff148);
  std::__cxx11::string::~string(local_a88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff168);
  std::__cxx11::string::~string(local_a68);
  std::__cxx11::string::~string(local_a48);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff188);
  std::__cxx11::string::~string(local_a28);
  std::__cxx11::string::~string(local_a08);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff1a8);
  std::__cxx11::string::~string(local_9e8);
  std::__cxx11::string::~string(local_9c8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff1c8);
  std::__cxx11::string::~string((string *)&local_988);
  std::__cxx11::string::~string((string *)&local_9a8);
  std::__cxx11::string::~string(local_968);
  std::__cxx11::string::~string(local_6a0);
  std::__cxx11::string::~string(local_680);
  std::__cxx11::string::~string(local_5d8);
  std::__cxx11::string::~string(local_5b8);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_d88);
  lVar1 = 0x108;
  do {
    RPCArg::~RPCArg((RPCArg *)((long)&local_288[0].m_names._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x108;
  } while (lVar1 != -0x108);
  RPCArgOptions::~RPCArgOptions(&local_510);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_db0);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_448);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string(local_3e8);
  RPCArgOptions::~RPCArgOptions(&local_3c8);
  std::__cxx11::string::~string(local_380);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_308);
  UniValue::~UniValue(&local_360);
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getnodeaddresses()
{
    return RPCHelpMan{"getnodeaddresses",
                "Return known addresses, after filtering for quality and recency.\n"
                "These can potentially be used to find new peers in the network.\n"
                "The total number of addresses known to the node may be higher.",
                {
                    {"count", RPCArg::Type::NUM, RPCArg::Default{1}, "The maximum number of addresses to return. Specify 0 to return all known addresses."},
                    {"network", RPCArg::Type::STR, RPCArg::DefaultHint{"all networks"}, "Return only addresses of the specified network. Can be one of: " + Join(GetNetworkNames(), ", ") + "."},
                },
                RPCResult{
                    RPCResult::Type::ARR, "", "",
                    {
                        {RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::NUM_TIME, "time", "The " + UNIX_EPOCH_TIME + " when the node was last seen"},
                            {RPCResult::Type::NUM, "services", "The services offered by the node"},
                            {RPCResult::Type::STR, "address", "The address of the node"},
                            {RPCResult::Type::NUM, "port", "The port number of the node"},
                            {RPCResult::Type::STR, "network", "The network (" + Join(GetNetworkNames(), ", ") + ") the node connected through"},
                        }},
                    }
                },
                RPCExamples{
                    HelpExampleCli("getnodeaddresses", "8")
                    + HelpExampleCli("getnodeaddresses", "4 \"i2p\"")
                    + HelpExampleCli("-named getnodeaddresses", "network=onion count=12")
                    + HelpExampleRpc("getnodeaddresses", "8")
                    + HelpExampleRpc("getnodeaddresses", "4, \"i2p\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    NodeContext& node = EnsureAnyNodeContext(request.context);
    const CConnman& connman = EnsureConnman(node);

    const int count{request.params[0].isNull() ? 1 : request.params[0].getInt<int>()};
    if (count < 0) throw JSONRPCError(RPC_INVALID_PARAMETER, "Address count out of range");

    const std::optional<Network> network{request.params[1].isNull() ? std::nullopt : std::optional<Network>{ParseNetwork(request.params[1].get_str())}};
    if (network == NET_UNROUTABLE) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Network not recognized: %s", request.params[1].get_str()));
    }

    // returns a shuffled list of CAddress
    const std::vector<CAddress> vAddr{connman.GetAddresses(count, /*max_pct=*/0, network)};
    UniValue ret(UniValue::VARR);

    for (const CAddress& addr : vAddr) {
        UniValue obj(UniValue::VOBJ);
        obj.pushKV("time", int64_t{TicksSinceEpoch<std::chrono::seconds>(addr.nTime)});
        obj.pushKV("services", (uint64_t)addr.nServices);
        obj.pushKV("address", addr.ToStringAddr());
        obj.pushKV("port", addr.GetPort());
        obj.pushKV("network", GetNetworkName(addr.GetNetClass()));
        ret.push_back(std::move(obj));
    }
    return ret;
},
    };
}